

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O0

double Cudd_ReadUsedSlots(DdManager *dd)

{
  undefined1 auVar1 [16];
  DdNode *sentinel;
  DdNode *node;
  DdSubtable *subtable;
  DdNodePtr *nodelist;
  uint local_20;
  int size;
  int j;
  int i;
  unsigned_long used;
  DdManager *dd_local;
  
  _j = 0;
  for (size = 0; size < dd->size; size = size + 1) {
    for (local_20 = 0; local_20 < dd->subtables[size].slots; local_20 = local_20 + 1) {
      if ((DdManager *)dd->subtables[size].nodelist[(int)local_20] != dd) {
        _j = _j + 1;
      }
    }
  }
  for (size = 0; size < dd->sizeZ; size = size + 1) {
    for (local_20 = 0; local_20 < dd->subtableZ[size].slots; local_20 = local_20 + 1) {
      if (dd->subtableZ[size].nodelist[(int)local_20] != (DdNode *)0x0) {
        _j = _j + 1;
      }
    }
  }
  for (local_20 = 0; local_20 < (dd->constants).slots; local_20 = local_20 + 1) {
    if ((dd->constants).nodelist[(int)local_20] != (DdNode *)0x0) {
      _j = _j + 1;
    }
  }
  auVar1._8_4_ = (int)((ulong)_j >> 0x20);
  auVar1._0_8_ = _j;
  auVar1._12_4_ = 0x45300000;
  return ((auVar1._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)_j) - 4503599627370496.0)) / (double)dd->slots;
}

Assistant:

double
Cudd_ReadUsedSlots(
  DdManager * dd)
{
    unsigned long used = 0;
    int i, j;
    int size = dd->size;
    DdNodePtr *nodelist;
    DdSubtable *subtable;
    DdNode *node;
    DdNode *sentinel = &(dd->sentinel);

    /* Scan each BDD/ADD subtable. */
    for (i = 0; i < size; i++) {
        subtable = &(dd->subtables[i]);
        nodelist = subtable->nodelist;
        for (j = 0; (unsigned) j < subtable->slots; j++) {
            node = nodelist[j];
            if (node != sentinel) {
                used++;
            }
        }
    }

    /* Scan the ZDD subtables. */
    size = dd->sizeZ;

    for (i = 0; i < size; i++) {
        subtable = &(dd->subtableZ[i]);
        nodelist = subtable->nodelist;
        for (j = 0; (unsigned) j < subtable->slots; j++) {
            node = nodelist[j];
            if (node != NULL) {
                used++;
            }
        }
    }

    /* Constant table. */
    subtable = &(dd->constants);
    nodelist = subtable->nodelist;
    for (j = 0; (unsigned) j < subtable->slots; j++) {
        node = nodelist[j];
        if (node != NULL) {
            used++;
        }
    }

    return((double)used / (double) dd->slots);

}